

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::UniformLocMixWithImplicit2::~UniformLocMixWithImplicit2
          (UniformLocMixWithImplicit2 *this)

{
  deqp::SubcaseBase::~SubcaseBase((SubcaseBase *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual long Run()
	{
		//uniform float[3] u0;
		//layout (location = 3) uniform vec3[2]  u1;
		//uniform int[3]   u2;
		//layout (location = 8) uniform ivec4   u3;
		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, 3), Loc::Implicit()));
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT_VEC3, 2), Loc::C(3)));
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_INT, 3), Loc::Implicit()));
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_INT_VEC4, 2), Loc::C(8)));
		return doRun(uniforms);
	}